

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tEXt(ucvector *out,char *keyword,char *textstring)

{
  ucvector *out_00;
  size_t size_00;
  char *in_RDX;
  char *in_RSI;
  uint error;
  size_t size;
  size_t textsize;
  size_t keysize;
  uchar *chunk;
  uchar *chunk_00;
  uchar **chunk_01;
  uint local_4;
  
  chunk_01 = (uchar **)0x0;
  out_00 = (ucvector *)lodepng_strlen(in_RSI);
  size_00 = lodepng_strlen(in_RDX);
  chunk_00 = (uchar *)((long)&out_00->data + size_00 + 1);
  if ((out_00 == (ucvector *)0x0) || ((ucvector *)0x4f < out_00)) {
    local_4 = 0x59;
  }
  else {
    local_4 = lodepng_chunk_init(chunk_01,out_00,(uint)(size_00 >> 0x20),(char *)chunk_00);
    if (local_4 == 0) {
      lodepng_memcpy(chunk_01 + 1,in_RSI,(size_t)out_00);
      *(undefined1 *)((long)chunk_01 + (long)&out_00->size) = 0;
      lodepng_memcpy((void *)((long)chunk_01 + (long)((long)&out_00->size + 1)),in_RDX,size_00);
      lodepng_chunk_generate_crc(chunk_00);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static unsigned addChunk_tEXt(ucvector* out, const char* keyword, const char* textstring) {
  unsigned char* chunk = 0;
  size_t keysize = lodepng_strlen(keyword), textsize = lodepng_strlen(textstring);
  size_t size = keysize + 1 + textsize;
  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, size, "tEXt"));
  lodepng_memcpy(chunk + 8, keyword, keysize);
  chunk[8 + keysize] = 0; /*null termination char*/
  lodepng_memcpy(chunk + 9 + keysize, textstring, textsize);
  lodepng_chunk_generate_crc(chunk);
  return 0;
}